

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageSorters.cpp
# Opt level: O2

void __thiscall FIX::message_order::message_order(message_order *this,int first,...)

{
  char in_AL;
  int iVar1;
  int iVar2;
  undefined8 in_RCX;
  uint uVar3;
  undefined8 in_RDX;
  int *piVar4;
  int *piVar5;
  ulong uVar6;
  int iVar7;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arguments;
  shared_array<int> local_f8;
  int local_e8 [4];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  this->m_mode = group;
  (this->m_groupOrder).m_size = 0;
  (this->m_groupOrder).m_buffer = (int *)0x0;
  this->m_delim = first;
  this->m_largest = first;
  piVar5 = (int *)&stack0x00000008;
  iVar2 = this->m_largest;
  uVar3 = 0x10;
  iVar1 = 0;
  iVar7 = first;
  while (iVar7 != 0) {
    if (iVar2 <= iVar7) {
      iVar2 = iVar7;
    }
    this->m_largest = iVar2;
    if (uVar3 < 0x29) {
      uVar6 = (ulong)uVar3;
      uVar3 = uVar3 + 8;
      piVar4 = (int *)((long)local_e8 + uVar6);
    }
    else {
      piVar4 = piVar5;
      piVar5 = piVar5 + 2;
    }
    iVar1 = iVar1 + -1;
    iVar7 = *piVar4;
  }
  if (iVar1 == 0) {
    this->m_largest = 0;
    this->m_delim = 0;
  }
  else {
    shared_array<int>::create(&local_f8,(long)(iVar2 + 1));
    shared_array<int>::operator=(&this->m_groupOrder,&local_f8);
    shared_array<int>::~shared_array(&local_f8);
    uVar3 = 0x10;
    arguments[0].overflow_arg_area = &stack0x00000008;
    piVar5 = (this->m_groupOrder).m_buffer;
    iVar2 = 1;
    while (first != 0) {
      piVar5[(long)first + 3] = iVar2;
      uVar6 = (ulong)uVar3;
      if (uVar6 < 0x29) {
        uVar3 = uVar3 + 8;
        piVar4 = (int *)((long)local_e8 + uVar6);
      }
      else {
        piVar4 = (int *)arguments[0].overflow_arg_area;
        arguments[0].overflow_arg_area = (void *)((long)arguments[0].overflow_arg_area + 8);
      }
      iVar2 = iVar2 + 1;
      first = *piVar4;
    }
  }
  return;
}

Assistant:

message_order::message_order(int first, ...)
    : m_mode(group),
      m_delim(0),
      m_largest(0) {
  int field = first;
  int size = 0;
  m_largest = m_delim = first;

  va_list arguments;
  va_start(arguments, first);
  while (field != 0) {
    m_largest = m_largest > field ? m_largest : field;

    size++;
    field = va_arg(arguments, int);
  }

  if (size) {
    m_groupOrder = shared_array<int>::create(m_largest + 1);

    va_start(arguments, first);
    field = first;
    int i = 0;
    while (field != 0) {
      m_groupOrder[field] = ++i;
      field = va_arg(arguments, int);
    }
  } else {
    m_largest = 0;
    m_delim = 0;
  }

  va_end(arguments);
}